

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

Array<const_unsigned_int> * __thiscall
kj::heapArray<unsigned_int_const,unsigned_int_const*>
          (Array<const_unsigned_int> *__return_storage_ptr__,kj *this,uint *begin,uint *end)

{
  uint *puVar1;
  long lVar2;
  Array<const_unsigned_int> *result;
  ArrayBuilder<const_unsigned_int> local_38;
  
  puVar1 = _::HeapArrayDisposer::allocateUninitialized<unsigned_int>((long)begin - (long)this >> 2);
  local_38.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  for (lVar2 = 0; this + lVar2 != (kj *)begin; lVar2 = lVar2 + 4) {
    *(uint *)((long)puVar1 + lVar2) = *(uint *)(this + lVar2);
  }
  __return_storage_ptr__->ptr = puVar1;
  __return_storage_ptr__->size_ = lVar2 >> 2;
  __return_storage_ptr__->disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  local_38.ptr = (uint *)0x0;
  local_38.pos = (RemoveConst<const_unsigned_int> *)0x0;
  local_38.endPtr = (uint *)0x0;
  ArrayBuilder<const_unsigned_int>::dispose(&local_38);
  return __return_storage_ptr__;
}

Assistant:

Array<T>
heapArray(Iterator begin, Iterator end) {
  ArrayBuilder<T> builder = heapArrayBuilder<T>(end - begin);
  builder.addAll(begin, end);
  return builder.finish();
}